

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O0

double __thiscall soplex::SPxSolverBase<double>::delta(SPxSolverBase<double> *this)

{
  element_type *peVar1;
  SPxSolverBase<double> *in_RDI;
  Real RVar2;
  Real RVar3;
  undefined8 local_20;
  
  tolerances(in_RDI);
  peVar1 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2f0850);
  RVar2 = Tolerances::floatingPointFeastol(peVar1);
  tolerances(in_RDI);
  peVar1 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2f0870);
  RVar3 = Tolerances::floatingPointOpttol(peVar1);
  if (RVar2 <= RVar3) {
    tolerances(in_RDI);
    peVar1 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2f08bb);
    local_20 = Tolerances::floatingPointOpttol(peVar1);
  }
  else {
    tolerances(in_RDI);
    peVar1 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2f0899);
    local_20 = Tolerances::floatingPointFeastol(peVar1);
  }
  return local_20;
}

Assistant:

R delta() const
   {
      return SOPLEX_MAX(this->tolerances()->floatingPointFeastol(),
                        this->tolerances()->floatingPointOpttol());
   }